

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O0

type * __thiscall
linalg::detail::apply<linalg::detail::op_div,void,linalg::mat<double,4,4>,double>::impl<0,1,2,3>
          (undefined8 param_1,mat<double,_4,_4> *__return_storage_ptr__,
          apply<linalg::detail::op_div,void,linalg::mat<double,4,4>,double> *this)

{
  getter<3> local_159;
  V local_158;
  V local_130;
  getter<2> local_109;
  V local_108;
  V local_e0;
  getter<1> local_b9;
  V local_b8;
  V local_90;
  getter<0> local_69;
  V local_68;
  V local_40;
  undefined8 local_20;
  double b_local;
  mat<double,_4,_4> *a_local;
  
  local_20 = param_1;
  b_local = (double)this;
  getter<0>::operator()(&local_68,&local_69,(mat<double,_4,_4> *)this);
  apply<linalg::detail::op_div,void,linalg::vec<double,4>,double>::impl<0,1,2,3>
            (local_20,(apply<linalg::detail::op_div,void,linalg::vec<double,4>,double> *)&local_40,
             &local_68);
  getter<1>::operator()(&local_b8,&local_b9,(mat<double,_4,_4> *)b_local);
  apply<linalg::detail::op_div,void,linalg::vec<double,4>,double>::impl<0,1,2,3>
            (local_20,(apply<linalg::detail::op_div,void,linalg::vec<double,4>,double> *)&local_90,
             &local_b8);
  getter<2>::operator()(&local_108,&local_109,(mat<double,_4,_4> *)b_local);
  apply<linalg::detail::op_div,void,linalg::vec<double,4>,double>::impl<0,1,2,3>
            (local_20,(apply<linalg::detail::op_div,void,linalg::vec<double,4>,double> *)&local_e0,
             &local_108);
  getter<3>::operator()(&local_158,&local_159,(mat<double,_4,_4> *)b_local);
  apply<linalg::detail::op_div,void,linalg::vec<double,4>,double>::impl<0,1,2,3>
            (local_20,(apply<linalg::detail::op_div,void,linalg::vec<double,4>,double> *)&local_130,
             &local_158);
  mat<double,_4,_4>::mat(__return_storage_ptr__,&local_40,&local_90,&local_e0,&local_130);
  return __return_storage_ptr__;
}

Assistant:

static constexpr type impl(seq<J...>, F f, const mat<A,M,N> & a, const mat<B,M,N> & b) { return {apply<F, void, vec<A,M>, vec<B,M>>::impl(make_seq<0,M>{}, f, getter<J>{}(a), getter<J>{}(b))...}; }